

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastV64P2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ParseContext *ctx_00;
  MessageLite *pMVar1;
  unsigned_short uVar2;
  uint16_t uVar3;
  uint uVar4;
  char *pcVar5;
  uint *puVar6;
  anon_class_8_1_a7e8901a add;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  RepeatedField<unsigned_long> *field;
  uint64_t local_60;
  TcParseTableBase *local_58;
  ParseContext *local_50;
  char *local_48;
  MessageLite *local_40;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_38 [2];
  uint local_24;
  TcParseTableBase *pTStack_20;
  uint32_t has_bits_offset;
  uint64_t local_18;
  MessageLite *local_10;
  
  local_60 = hasbits;
  local_58 = table;
  local_50 = ctx;
  local_48 = ptr;
  local_40 = msg;
  local_38[0] = data.field_0;
  uVar2 = TcFieldData::coded_tag<unsigned_short>((TcFieldData *)local_38);
  pMVar1 = local_40;
  pcVar5 = local_48;
  ctx_00 = local_50;
  if (uVar2 != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&field);
    pcVar5 = MiniParse(pMVar1,pcVar5,ctx_00,(TcFieldData)field,local_58,local_60);
    return pcVar5;
  }
  local_48 = local_48 + 2;
  local_10 = local_40;
  local_18 = local_60;
  pTStack_20 = local_58;
  local_24 = (uint)local_58->has_bits_offset;
  if (local_24 != 0) {
    uVar4 = (uint)local_60;
    puVar6 = RefAt<unsigned_int>(local_40,(ulong)local_24);
    *puVar6 = uVar4 | *puVar6;
  }
  pMVar1 = local_40;
  uVar3 = TcFieldData::offset((TcFieldData *)local_38);
  add.field = RefAt<google::protobuf::RepeatedField<unsigned_long>>(pMVar1,(ulong)uVar3);
  pcVar5 = EpsCopyInputStream::
           ReadPackedVarint<google::protobuf::internal::TcParser::PackedVarint<unsigned_long,unsigned_short,false>(google::protobuf::MessageLite*,char_const*,google::protobuf::internal::ParseContext*,google::protobuf::internal::TcFieldData,google::protobuf::internal::TcParseTableBase_const*,unsigned_long)::_lambda(unsigned_long)_1_>
                     (&local_50->super_EpsCopyInputStream,local_48,add);
  return pcVar5;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV64P2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return PackedVarint<uint64_t, uint16_t>(
      PROTOBUF_TC_PARAM_PASS);
}